

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFPageObjectHelper::addContentTokenFilter
          (QPDFPageObjectHelper *this,shared_ptr<QPDFObjectHandle::TokenFilter> *token_filter)

{
  bool bVar1;
  shared_ptr<QPDFObjectHandle::TokenFilter> local_78;
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  shared_ptr<QPDFObjectHandle::TokenFilter> *token_filter_local;
  QPDFPageObjectHelper *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)token_filter;
  token_filter_local = (shared_ptr<QPDFObjectHandle::TokenFilter> *)this;
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffd8);
  bVar1 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  if (bVar1) {
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_48);
    std::shared_ptr<QPDFObjectHandle::TokenFilter>::shared_ptr
              ((shared_ptr<QPDFObjectHandle::TokenFilter> *)(local_68 + 0x10),token_filter);
    QPDFObjectHandle::addTokenFilter
              ((QPDFObjectHandle *)local_48,
               (shared_ptr<QPDFObjectHandle::TokenFilter> *)(local_68 + 0x10));
    std::shared_ptr<QPDFObjectHandle::TokenFilter>::~shared_ptr
              ((shared_ptr<QPDFObjectHandle::TokenFilter> *)(local_68 + 0x10));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
  }
  else {
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_68);
    std::shared_ptr<QPDFObjectHandle::TokenFilter>::shared_ptr(&local_78,token_filter);
    QPDFObjectHandle::addContentTokenFilter((QPDFObjectHandle *)local_68,&local_78);
    std::shared_ptr<QPDFObjectHandle::TokenFilter>::~shared_ptr(&local_78);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_68);
  }
  return;
}

Assistant:

void
QPDFPageObjectHelper::addContentTokenFilter(
    std::shared_ptr<QPDFObjectHandle::TokenFilter> token_filter)
{
    if (oh().isFormXObject()) {
        oh().addTokenFilter(token_filter);
    } else {
        oh().addContentTokenFilter(token_filter);
    }
}